

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int file_seek(int pi,uint handle,int32_t seekOffset,int seekFrom)

{
  int iVar1;
  int seekFrom_local;
  gpioExtent_t ext [1];
  
  ext[0].ptr = &seekFrom_local;
  ext[0].size = 4;
  seekFrom_local = seekFrom;
  iVar1 = pigpio_command_ext(pi,0x6c,handle,seekOffset,4,1,ext,1);
  return iVar1;
}

Assistant:

int file_seek(int pi, unsigned handle, int32_t seekOffset, int seekFrom)
{
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=seekOffset
   p3=4
   ## extension ##
   uint32_t seekFrom
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &seekFrom;

   return pigpio_command_ext
      (pi, PI_CMD_FS, handle, seekOffset, 4, 1, ext, 1);
}